

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntervalMap.h
# Opt level: O3

void __thiscall
slang::IntervalMap<unsigned_long,_const_slang::ast::Expression_*,_5U>::const_iterator::setToFind
          (const_iterator *this,unsigned_long left,unsigned_long right)

{
  size_type sVar1;
  pointer pEVar2;
  ulong uVar3;
  unsigned_long *puVar4;
  int iVar5;
  IntervalMap<unsigned_long,_const_slang::ast::Expression_*,_5U> *pIVar6;
  uint uVar7;
  ulong uVar8;
  ulong *puVar9;
  uint32_t uVar10;
  long lVar11;
  ulong uVar12;
  int iVar13;
  uint uStack_3c;
  NodeRef NStack_38;
  
  pIVar6 = this->map;
  if (pIVar6->height != 0) {
    uVar10 = this->map->rootSize;
    if (uVar10 == 0) {
LAB_0040dc6d:
      uVar10 = 0;
    }
    else {
      puVar4 = &(this->map->field_0).rootLeaf.
                super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_const_slang::ast::Expression_*,_5U>
                .first[2].right;
      iVar5 = 1;
      do {
        if (left <= *puVar4) {
          if (iVar5 == 1) goto LAB_0040dc6d;
          uVar10 = -iVar5;
          goto LAB_0040dc75;
        }
        iVar13 = uVar10 + iVar5;
        iVar5 = iVar5 + -1;
        puVar4 = puVar4 + 2;
      } while (iVar13 != 2);
      uVar10 = uVar10 - 1;
    }
LAB_0040dc75:
    setRoot(this,uVar10);
    sVar1 = (this->path).path.super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len;
    if ((sVar1 != 0) &&
       (pEVar2 = (this->path).path.super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.
                 data_, pEVar2->offset < pEVar2->size)) {
      iVar5 = (int)sVar1;
      uVar7 = iVar5 - 1;
      NStack_38.pip.value =
           *(PointerIntPair<void_*,_6U,_6U,_unsigned_int> *)
            ((long)pEVar2[uVar7].node + (ulong)pEVar2[uVar7].offset * 8);
      iVar5 = this->map->height - iVar5;
      if (iVar5 != 0) {
        do {
          uVar12 = (ulong)NStack_38.pip.value & 0xffffffffffffffc0;
          uVar7 = SUB84(NStack_38.pip.value,0) & 0x3f;
          iVar13 = uVar7 + 1;
          puVar9 = (ulong *)(uVar12 + 0x40);
          lVar11 = 0;
          do {
            if (left <= *puVar9) {
              iVar13 = (int)lVar11;
              break;
            }
            lVar11 = lVar11 + 1;
            puVar9 = puVar9 + 2;
          } while ((ulong)uVar7 + 1 != lVar11);
          uStack_3c = iVar13 - 1;
          if (iVar13 == 0) {
            uStack_3c = 0;
          }
          uVar3 = (ulong)uStack_3c;
          SmallVectorBase<slang::IntervalMapDetails::Path::Entry>::
          emplace_back<slang::IntervalMapDetails::NodeRef&,unsigned_int&>
                    ((SmallVectorBase<slang::IntervalMapDetails::Path::Entry> *)&this->path,
                     &NStack_38,&uStack_3c);
          NStack_38.pip.value =
               *(PointerIntPair<void_*,_6U,_6U,_unsigned_int> *)(uVar12 + uVar3 * 8);
          iVar5 = iVar5 + -1;
        } while (iVar5 != 0);
      }
      puVar9 = (ulong *)((ulong)NStack_38.pip.value & 0xffffffffffffffc0);
      uVar7 = SUB84(NStack_38.pip.value,0) & 0x3f;
      uStack_3c = uVar7 + 1;
      lVar11 = 0;
      do {
        if (left <= *puVar9) {
          uStack_3c = (uint)lVar11;
          break;
        }
        lVar11 = lVar11 + 1;
        puVar9 = puVar9 + 2;
      } while ((ulong)uVar7 + 1 != lVar11);
      SmallVectorBase<slang::IntervalMapDetails::Path::Entry>::
      emplace_back<slang::IntervalMapDetails::NodeRef&,unsigned_int&>
                ((SmallVectorBase<slang::IntervalMapDetails::Path::Entry> *)&this->path,&NStack_38,
                 &uStack_3c);
    }
    return;
  }
  uVar8 = (ulong)pIVar6->rootSize;
  uVar3 = 0;
  uVar12 = uVar3;
  if (uVar8 != 0) {
    do {
      uVar12 = uVar3;
      if (left <= (pIVar6->field_0).rootLeaf.
                  super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_const_slang::ast::Expression_*,_5U>
                  .first[0].left) break;
      uVar3 = uVar3 + 1;
      pIVar6 = (IntervalMap<unsigned_long,_const_slang::ast::Expression_*,_5U> *)
               ((pIVar6->field_0).rootLeaf.
                super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_const_slang::ast::Expression_*,_5U>
                .first + 1);
      uVar12 = uVar8;
    } while (uVar8 != uVar3);
  }
  setRoot(this,(uint32_t)uVar12);
  return;
}

Assistant:

bool isFlat() const {
        SLANG_ASSERT(map);
        return map->isFlat();
    }